

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

void __thiscall
CMU462::StaticScene::AreaLight::AreaLight
          (AreaLight *this,Spectrum *rad,Vector3D *pos,Vector3D *dir,Vector3D *dim_x,Vector3D *dim_y
          )

{
  double dVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_0026bbe0;
  fVar4 = rad->g;
  (this->radiance).r = rad->r;
  (this->radiance).g = fVar4;
  (this->radiance).b = rad->b;
  dVar1 = pos->y;
  (this->position).x = pos->x;
  (this->position).y = dVar1;
  (this->position).z = pos->z;
  dVar1 = dir->y;
  (this->direction).x = dir->x;
  (this->direction).y = dVar1;
  (this->direction).z = dir->z;
  dVar1 = dim_x->y;
  (this->dim_x).x = dim_x->x;
  (this->dim_x).y = dVar1;
  (this->dim_x).z = dim_x->z;
  dVar2 = dim_y->x;
  dVar3 = dim_y->y;
  (this->dim_y).x = dVar2;
  (this->dim_y).y = dVar3;
  dVar1 = dim_y->z;
  (this->dim_y).z = dVar1;
  (this->sampler).super_Sampler2D._vptr_Sampler2D = (_func_int **)&PTR__Sampler2D_0026c120;
  this->area = (float)(SQRT(dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3) *
                      SQRT(dim_x->z * dim_x->z + dim_x->x * dim_x->x + dim_x->y * dim_x->y));
  return;
}

Assistant:

AreaLight::AreaLight(const Spectrum& rad, 
                     const Vector3D& pos,   const Vector3D& dir, 
                     const Vector3D& dim_x, const Vector3D& dim_y)
  : radiance(rad), position(pos), direction(dir),
    dim_x(dim_x), dim_y(dim_y), area(dim_x.norm() * dim_y.norm()) { }